

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

void int_times(IntVar *x,IntVar *y,IntVar *z)

{
  IntView<0> _y;
  IntView<0> _y_00;
  IntView<1> _y_01;
  IntView<0> _y_02;
  IntView<1> _y_03;
  IntView<0> _y_04;
  IntView<0> _x;
  IntView<0> _x_00;
  IntView<0> _x_01;
  IntView<1> _x_02;
  IntView<1> _x_03;
  IntView<0> _x_04;
  IntView<0> _z;
  IntView<0> _z_00;
  IntView<1> _z_01;
  IntView<1> _z_02;
  IntView<0> _z_03;
  IntView<0> _z_04;
  int iVar1;
  void *pvVar2;
  IntVar *pIVar3;
  TimesAll<0,_0,_0> *this;
  IntVar *in_RDX;
  IntVar *in_RSI;
  IntVar *in_RDI;
  bool z_flip;
  bool y_flip;
  bool x_flip;
  IntVar *in_stack_fffffffffffffe08;
  Times<0,_0,_0> *in_stack_fffffffffffffe20;
  IntVar *in_stack_fffffffffffffe28;
  undefined8 in_stack_fffffffffffffe30;
  IntVar *in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  IntVar *in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe58;
  IntView<0> local_1a0;
  IntView<0> local_190;
  IntView<0> local_180;
  IntView<0> local_170;
  IntView<1> local_160;
  IntView<0> local_150;
  IntView<1> local_140;
  IntView<0> local_130;
  IntView<1> local_120;
  IntView<0> local_110;
  IntView<0> local_100;
  IntView<1> local_f0;
  IntView<0> local_e0;
  IntView<1> local_d0;
  IntView<0> local_c0;
  IntView<1> local_b0;
  IntView<0> local_a0;
  IntView<0> local_90;
  IntView<0> local_80;
  IntView<0> local_70;
  undefined1 local_5b;
  byte local_5a;
  byte local_59;
  IntView<0> local_58;
  IntView<0> local_48 [2];
  IntView<0> local_28;
  IntVar *local_18;
  IntVar *local_10;
  IntVar *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar1 = get_sign(in_stack_fffffffffffffe08);
  if (((iVar1 == 0) || (iVar1 = get_sign(in_stack_fffffffffffffe08), iVar1 == 0)) ||
     (iVar1 = get_sign(in_stack_fffffffffffffe08), iVar1 == 0)) {
    operator_new(0x48);
    IntView<0>::IntView(&local_28,local_8,1,0);
    IntView<0>::IntView(local_48,local_10,1,0);
    IntView<0>::IntView(&local_58,local_18,1,0);
    _x.a = (int)in_stack_fffffffffffffe40;
    _x.b = (int)((ulong)in_stack_fffffffffffffe40 >> 0x20);
    _x.var = in_stack_fffffffffffffe38;
    _y.a = (int)in_stack_fffffffffffffe30;
    _y.b = (int)((ulong)in_stack_fffffffffffffe30 >> 0x20);
    _y.var = in_stack_fffffffffffffe28;
    _z.a = (int)in_stack_fffffffffffffe58;
    _z.b = SUB84(in_stack_fffffffffffffe58,4);
    _z.var = in_stack_fffffffffffffe50;
    TimesAll<0,_0,_0>::TimesAll((TimesAll<0,_0,_0> *)in_stack_fffffffffffffe20,_x,_y,_z);
  }
  else {
    iVar1 = get_sign(in_stack_fffffffffffffe08);
    local_59 = iVar1 == -1;
    iVar1 = get_sign(in_stack_fffffffffffffe08);
    local_5a = iVar1 == -1;
    iVar1 = get_sign(in_stack_fffffffffffffe08);
    local_5b = iVar1 == -1;
    if ((((local_59 & 1) != 0) || ((local_5a & 1) != 0)) || ((bool)local_5b)) {
      if ((((local_59 & 1) == 0) && ((local_5a & 1) != 0)) && ((bool)local_5b)) {
        pIVar3 = (IntVar *)operator_new(0x50);
        IntView<0>::IntView(&local_a0,local_8,1,0);
        IntView<0>::IntView(&local_c0,local_10,1,0);
        IntView<1>::IntView<0>(&local_b0,&local_c0);
        IntView<0>::IntView(&local_e0,local_18,1,0);
        IntView<1>::IntView<0>(&local_d0,&local_e0);
        _x_01.a = (int)in_stack_fffffffffffffe40;
        _x_01.b = (int)((ulong)in_stack_fffffffffffffe40 >> 0x20);
        _x_01.var = pIVar3;
        _y_01.a = (int)in_stack_fffffffffffffe30;
        _y_01.b = (int)((ulong)in_stack_fffffffffffffe30 >> 0x20);
        _y_01.var = in_stack_fffffffffffffe28;
        _z_01.a = (int)in_stack_fffffffffffffe58;
        _z_01.b = SUB84(in_stack_fffffffffffffe58,4);
        _z_01.var = in_stack_fffffffffffffe50;
        Times<0,_1,_1>::Times((Times<0,_1,_1> *)in_stack_fffffffffffffe20,_x_01,_y_01,_z_01);
      }
      else if ((((local_59 & 1) == 0) || ((local_5a & 1) != 0)) || (!(bool)local_5b)) {
        if ((((local_59 & 1) == 0) || ((local_5a & 1) == 0)) || ((bool)local_5b)) {
          this = (TimesAll<0,_0,_0> *)operator_new(0x48);
          IntView<0>::IntView(&local_190,local_8,1,0);
          IntView<0>::IntView(&local_1a0,local_10,1,0);
          IntView<0>::IntView((IntView<0> *)&stack0xfffffffffffffe50,local_18,1,0);
          _x_04.a = (int)in_stack_fffffffffffffe40;
          _x_04.b = (int)((ulong)in_stack_fffffffffffffe40 >> 0x20);
          _x_04.var = in_stack_fffffffffffffe38;
          _y_04.a = (int)in_stack_fffffffffffffe30;
          _y_04.b = (int)((ulong)in_stack_fffffffffffffe30 >> 0x20);
          _y_04.var = in_stack_fffffffffffffe28;
          _z_04.a = (int)in_stack_fffffffffffffe58;
          _z_04.b = SUB84(in_stack_fffffffffffffe58,4);
          _z_04.var = in_stack_fffffffffffffe50;
          TimesAll<0,_0,_0>::TimesAll(this,_x_04,_y_04,_z_04);
        }
        else {
          pIVar3 = (IntVar *)operator_new(0x50);
          IntView<0>::IntView(&local_150,local_8,1,0);
          IntView<1>::IntView<0>(&local_140,&local_150);
          IntView<0>::IntView(&local_170,local_10,1,0);
          IntView<1>::IntView<0>(&local_160,&local_170);
          IntView<0>::IntView(&local_180,local_18,1,0);
          _x_03.a = (int)in_stack_fffffffffffffe40;
          _x_03.b = (int)((ulong)in_stack_fffffffffffffe40 >> 0x20);
          _x_03.var = in_stack_fffffffffffffe38;
          _y_03.a = (int)in_stack_fffffffffffffe30;
          _y_03.b = (int)((ulong)in_stack_fffffffffffffe30 >> 0x20);
          _y_03.var = pIVar3;
          _z_03.a = (int)in_stack_fffffffffffffe58;
          _z_03.b = SUB84(in_stack_fffffffffffffe58,4);
          _z_03.var = in_stack_fffffffffffffe50;
          Times<1,_1,_0>::Times((Times<1,_1,_0> *)in_stack_fffffffffffffe20,_x_03,_y_03,_z_03);
        }
      }
      else {
        pvVar2 = operator_new(0x50);
        IntView<0>::IntView(&local_100,local_8,1,0);
        IntView<1>::IntView<0>(&local_f0,&local_100);
        IntView<0>::IntView(&local_110,local_10,1,0);
        IntView<0>::IntView(&local_130,local_18,1,0);
        IntView<1>::IntView<0>(&local_120,&local_130);
        _x_02.a = (int)in_stack_fffffffffffffe40;
        _x_02.b = (int)((ulong)in_stack_fffffffffffffe40 >> 0x20);
        _x_02.var = in_stack_fffffffffffffe38;
        _y_02._8_8_ = pvVar2;
        _y_02.var = in_stack_fffffffffffffe28;
        _z_02.a = (int)in_stack_fffffffffffffe58;
        _z_02.b = SUB84(in_stack_fffffffffffffe58,4);
        _z_02.var = in_stack_fffffffffffffe50;
        Times<1,_0,_1>::Times((Times<1,_0,_1> *)in_stack_fffffffffffffe20,_x_02,_y_02,_z_02);
      }
    }
    else {
      pvVar2 = operator_new(0x50);
      IntView<0>::IntView(&local_70,local_8,1,0);
      IntView<0>::IntView(&local_80,local_10,1,0);
      IntView<0>::IntView(&local_90,local_18,1,0);
      _x_00._8_8_ = pvVar2;
      _x_00.var = in_stack_fffffffffffffe38;
      _y_00.a = (int)in_stack_fffffffffffffe30;
      _y_00.b = (int)((ulong)in_stack_fffffffffffffe30 >> 0x20);
      _y_00.var = in_stack_fffffffffffffe28;
      _z_00.a = (int)in_stack_fffffffffffffe58;
      _z_00.b = SUB84(in_stack_fffffffffffffe58,4);
      _z_00.var = in_stack_fffffffffffffe50;
      Times<0,_0,_0>::Times(in_stack_fffffffffffffe20,_x_00,_y_00,_z_00);
    }
  }
  return;
}

Assistant:

void int_times(IntVar* x, IntVar* y, IntVar* z) {
	if ((get_sign(x) == 0) || (get_sign(y) == 0) || (get_sign(z) == 0)) {
		new TimesAll<0, 0, 0>(IntView<>(x), IntView<>(y), IntView<>(z));
	} else {
		const bool x_flip = (get_sign(x) == -1);
		const bool y_flip = (get_sign(y) == -1);
		const bool z_flip = (get_sign(z) == -1);

		if (!x_flip && !y_flip && !z_flip) {
			new Times<0, 0, 0>(IntView<>(x), IntView<>(y), IntView<>(z));
		} else if (!x_flip && y_flip && z_flip) {
			new Times<0, 1, 1>(IntView<>(x), IntView<>(y), IntView<>(z));
		} else if (x_flip && !y_flip && z_flip) {
			new Times<1, 0, 1>(IntView<>(x), IntView<>(y), IntView<>(z));
		} else if (x_flip && y_flip && !z_flip) {
			new Times<1, 1, 0>(IntView<>(x), IntView<>(y), IntView<>(z));
		} else {
			new TimesAll<0, 0, 0>(IntView<>(x), IntView<>(y), IntView<>(z));
		}
	}
}